

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scavenger.cpp
# Opt level: O1

void __thiscall pstore::broker::scavenger::thread_entry(scavenger *this)

{
  long *plVar1;
  int iVar2;
  undefined8 *puVar3;
  command_processor *this_00;
  not_null<const_char_*> nVar4;
  int iVar5;
  long lVar6;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar7;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination_2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long *in_FS_OFFSET;
  bool bVar8;
  unique_lock<std::mutex> lock;
  not_null<const_char_*> local_70;
  not_null<const_char_*> local_68;
  unique_lock<std::mutex> local_60;
  condition_variable *local_50;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  not_null<const_char_*> local_40 [2];
  
  local_60._M_owns = false;
  local_60._M_device = &this->mut_;
  std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  local_50 = &this->cv_;
  plVar1 = (long *)(*in_FS_OFFSET + -8);
  do {
    lVar6 = std::chrono::_V2::steady_clock::now();
    local_48.__d.__r = (duration)(lVar6 + 600000000000);
    std::condition_variable::
    __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (local_50,&local_60,&local_48);
    local_68.ptr_ = "begin scavenging";
    pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_68);
    nVar4.ptr_ = local_68.ptr_;
    pstore::details::log_destinations::__tls_init();
    if (*plVar1 != 0) {
      pstore::details::log_destinations::__tls_init();
      puVar3 = (undefined8 *)((undefined8 *)*plVar1)[1];
      for (puVar7 = *(undefined8 **)*plVar1; puVar7 != puVar3; puVar7 = puVar7 + 1) {
        (**(code **)(*(long *)*puVar7 + 0x48))((long *)*puVar7,6,nVar4.ptr_);
      }
    }
    if ((done & 1) != 0) {
      std::unique_lock<std::mutex>::~unique_lock(&local_60);
      local_40[0].ptr_ = "scavenger thread exiting";
      pstore::gsl::not_null<const_char_*>::ensure_invariant(local_40);
      nVar4.ptr_ = local_40[0].ptr_;
      pstore::details::log_destinations::__tls_init();
      lVar6 = *in_FS_OFFSET;
      if (*(long *)(lVar6 + -8) != 0) {
        pstore::details::log_destinations::__tls_init();
        puVar7 = *(undefined8 **)(lVar6 + -8);
        puVar3 = (undefined8 *)puVar7[1];
        for (puVar7 = (undefined8 *)*puVar7; puVar7 != puVar3; puVar7 = puVar7 + 1) {
          (**(code **)(*(long *)*puVar7 + 0x48))((long *)*puVar7,6,nVar4.ptr_);
        }
      }
      return;
    }
    this_01 = (this->cp_).
              super___weak_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar5 = this_01->_M_use_count;
      do {
        if (iVar5 == 0) {
          this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar2 = this_01->_M_use_count;
        bVar8 = iVar5 == iVar2;
        if (bVar8) {
          this_01->_M_use_count = iVar5 + 1;
          iVar2 = iVar5;
        }
        iVar5 = iVar2;
        UNLOCK();
      } while (!bVar8);
    }
    if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar8 = true;
    }
    else {
      bVar8 = this_01->_M_use_count == 0;
    }
    this_00 = (this->cp_).
              super___weak_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (!(bool)(this_00 == (command_processor *)0x0 | bVar8)) {
      command_processor::scavenge(this_00);
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    local_70.ptr_ = "scavenging done";
    pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_70);
    nVar4.ptr_ = local_70.ptr_;
    pstore::details::log_destinations::__tls_init();
    if (*plVar1 != 0) {
      pstore::details::log_destinations::__tls_init();
      puVar3 = (undefined8 *)((undefined8 *)*plVar1)[1];
      for (puVar7 = *(undefined8 **)*plVar1; puVar7 != puVar3; puVar7 = puVar7 + 1) {
        (**(code **)(*(long *)*puVar7 + 0x48))((long *)*puVar7,6,nVar4.ptr_);
      }
    }
  } while( true );
}

Assistant:

void scavenger::thread_entry () {
            try {
                std::unique_lock<decltype (mut_)> lock (mut_);
                auto const sleep_time =
                    std::chrono::seconds (10 * 60); // TODO: make this configurable by the user.
                for (;;) {
                    cv_.wait_for (lock, sleep_time);
                    log (logger::priority::info, "begin scavenging");
                    if (done) {
                        break;
                    }

                    // If the command processor still exists, ask it to scavenge any stale records.
                    if (auto const scp = cp_.lock ()) {
                        scp->scavenge ();
                    }

                    log (logger::priority::info, "scavenging done");
                }
            } catch (std::exception const & ex) {
                log (logger::priority::error, "error:", ex.what ());
            } catch (...) {
                log (logger::priority::error, "unknown exception");
            }
            log (logger::priority::info, "scavenger thread exiting");
        }